

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

void vkt::anon_unknown_0::markUndefined
               (vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                *values,BVec4 *mask,UVec2 *targetSize,UVec2 *offset,UVec2 *size)

{
  uint uVar1;
  uint uVar2;
  bool *pbVar3;
  reference this;
  undefined4 local_3c;
  undefined4 local_38;
  int compNdx;
  deUint32 x;
  deUint32 y;
  UVec2 *size_local;
  UVec2 *offset_local;
  UVec2 *targetSize_local;
  BVec4 *mask_local;
  vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
  *values_local;
  
  compNdx = tcu::Vector<unsigned_int,_2>::y(offset);
  while( true ) {
    uVar1 = tcu::Vector<unsigned_int,_2>::y(offset);
    uVar2 = tcu::Vector<unsigned_int,_2>::y(size);
    if (uVar1 + uVar2 <= (uint)compNdx) break;
    local_38 = tcu::Vector<unsigned_int,_2>::x(offset);
    while( true ) {
      uVar1 = tcu::Vector<unsigned_int,_2>::x(offset);
      uVar2 = tcu::Vector<unsigned_int,_2>::x(size);
      if (uVar1 + uVar2 <= local_38) break;
      for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
        pbVar3 = tcu::Vector<bool,_4>::operator[](mask,local_3c);
        if ((*pbVar3 & 1U) != 0) {
          uVar1 = tcu::Vector<unsigned_int,_2>::x(targetSize);
          this = std::
                 vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                 ::operator[](values,(ulong)(local_38 + compNdx * uVar1));
          PixelValue::setUndefined(this,(long)local_3c);
        }
      }
      local_38 = local_38 + 1;
    }
    compNdx = compNdx + 1;
  }
  return;
}

Assistant:

void markUndefined (vector<PixelValue>&	values,
					const BVec4&		mask,
					const UVec2&		targetSize,
					const UVec2&		offset,
					const UVec2&		size)
{
	DE_ASSERT(targetSize.x() * targetSize.y() == (deUint32)values.size());

	for (deUint32 y = offset.y(); y < offset.y() + size.y(); y++)
	for (deUint32 x = offset.x(); x < offset.x() + size.x(); x++)
	{
		for (int compNdx = 0; compNdx < 4; compNdx++)
		{
			if (mask[compNdx])
				values[x + y * targetSize.x()].setUndefined(compNdx);
		}
	}
}